

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int __thiscall ON_Interval::Clamp(ON_Interval *this,double *v)

{
  int iVar1;
  double dVar2;
  
  dVar2 = this->m_t[0];
  iVar1 = -1;
  if (dVar2 <= *v) {
    dVar2 = this->m_t[1];
    iVar1 = 1;
    if (*v <= dVar2) {
      return 0;
    }
  }
  *v = dVar2;
  return iVar1;
}

Assistant:

int 
ON_Interval::Clamp(double& v) const
{
  int rval = 0;
  if (v < m_t[0]) {
    v = m_t[0];
    rval = -1;
  }
  else if (v > m_t[1]) {
    v = m_t[1];
    rval = 1;
  }
  return rval;
}